

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O3

ngram_file_type_t ngram_file_name_to_type(char *file_name)

{
  char cVar1;
  int32 iVar2;
  char *pcVar3;
  char *pcVar4;
  ngram_file_type_t nVar5;
  
  pcVar3 = strrchr(file_name,0x2e);
  if (pcVar3 == (char *)0x0) {
    return NGRAM_INVALID;
  }
  iVar2 = strcmp_nocase(pcVar3,".gz");
  if (iVar2 == 0) {
    pcVar4 = pcVar3 + -1;
    do {
      if (pcVar4 < file_name) {
        return NGRAM_INVALID;
      }
      pcVar3 = pcVar4 + -1;
      cVar1 = *pcVar4;
      pcVar4 = pcVar3;
    } while (cVar1 != '.');
  }
  else {
    iVar2 = strcmp_nocase(pcVar3,".bz2");
    if (iVar2 != 0) goto LAB_001048f0;
    pcVar4 = pcVar3 + -1;
    do {
      if (pcVar4 < file_name) {
        return NGRAM_INVALID;
      }
      pcVar3 = pcVar4 + -1;
      cVar1 = *pcVar4;
      pcVar4 = pcVar3;
    } while (cVar1 != '.');
  }
  pcVar3 = pcVar3 + 1;
LAB_001048f0:
  iVar2 = strncmp_nocase(pcVar3,".ARPA",5);
  if (iVar2 == 0) {
    nVar5 = NGRAM_ARPA;
  }
  else {
    iVar2 = strncmp_nocase(pcVar3,".DMP",4);
    if (iVar2 == 0) {
      nVar5 = NGRAM_BIN;
    }
    else {
      iVar2 = strncmp_nocase(pcVar3,".BIN",4);
      nVar5 = -(uint)(iVar2 != 0) | NGRAM_BIN;
    }
  }
  return nVar5;
}

Assistant:

ngram_file_type_t
ngram_file_name_to_type(const char *file_name)
{
    const char *ext;

    ext = strrchr(file_name, '.');
    if (ext == NULL) {
        return NGRAM_INVALID;
    }
    if (0 == strcmp_nocase(ext, ".gz")) {
        while (--ext >= file_name) {
            if (*ext == '.')
                break;
        }
        if (ext < file_name) {
            return NGRAM_INVALID;
        }
    }
    else if (0 == strcmp_nocase(ext, ".bz2")) {
        while (--ext >= file_name) {
            if (*ext == '.')
                break;
        }
        if (ext < file_name) {
            return NGRAM_INVALID;
        }
    }
    /* We use strncmp because there might be a .gz on the end. */
    if (0 == strncmp_nocase(ext, ".ARPA", 5))
        return NGRAM_ARPA;
    if (0 == strncmp_nocase(ext, ".DMP", 4)
        || 0 == strncmp_nocase(ext, ".BIN", 4))
        return NGRAM_BIN;
    return NGRAM_INVALID;
}